

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O0

string * rcg::ensureNewFileName(string *name)

{
  byte bVar1;
  long lVar2;
  ostream *poVar3;
  string *in_RSI;
  string *in_RDI;
  ostringstream s;
  int n;
  size_t i;
  string suffix;
  ifstream file;
  int local_454;
  string local_450 [32];
  string local_430 [32];
  ostringstream local_410 [380];
  int local_294;
  string local_290 [32];
  string local_270 [32];
  long local_250;
  string local_248 [48];
  string local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::ifstream::close();
    std::__cxx11::string::string(local_248);
    local_250 = std::__cxx11::string::rfind((char)in_RSI,0x2e);
    if ((local_250 != -1) && (lVar2 = std::__cxx11::string::size(), (ulong)(lVar2 - local_250) < 5))
    {
      std::__cxx11::string::substr((ulong)local_270,(ulong)in_RSI);
      std::__cxx11::string::operator=(local_248,local_270);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::string::substr((ulong)local_290,(ulong)in_RSI);
      std::__cxx11::string::operator=(in_RSI,local_290);
      std::__cxx11::string::~string(local_290);
    }
    local_294 = 1;
    do {
      if (99 < local_294) break;
      std::__cxx11::ostringstream::ostringstream(local_410);
      poVar3 = std::operator<<((ostream *)local_410,in_RSI);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_294);
      std::operator<<(poVar3,local_248);
      std::__cxx11::ostringstream::str();
      std::ifstream::open(local_218,(_Ios_Openmode)local_430);
      std::__cxx11::string::~string(local_430);
      bVar1 = std::ifstream::is_open();
      if ((bVar1 & 1) == 0) {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(in_RSI,local_450);
        std::__cxx11::string::~string(local_450);
        local_454 = 3;
      }
      else {
        std::ifstream::close();
        local_294 = local_294 + 1;
        local_454 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_410);
    } while (local_454 == 0);
    std::__cxx11::string::~string(local_248);
  }
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::string ensureNewFileName(std::string name)
{
  // check if given name is already used

  std::ifstream file(name);

  if (file.is_open())
  {
    file.close();

    // split name in prefix and suffix

    std::string suffix;

    size_t i=name.rfind('.');
    if (i != name.npos && name.size()-i <= 4)
    {
      suffix=name.substr(i);
      name=name.substr(0, i);
    }

    // add number for finding name that is nor used

    int n=1;
    while (n < 100)
    {
      std::ostringstream s;
      s << name << "_" << n << suffix;

      file.open(s.str());
      if (!file.is_open())
      {
        name=s.str();
        break;
      }

      file.close();
      n++;
    }
  }

  return name;
}